

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.c
# Opt level: O2

int decode_unicode_char(uint32_t u,char *code)

{
  byte bVar1;
  
  bVar1 = (byte)u;
  if (u < 0x80) {
    *code = '\x01';
    code[1] = bVar1;
  }
  else if (u < 0x800) {
    *code = '\x02';
    code[1] = (byte)(u >> 6) | 0xc0;
    code[2] = bVar1 & 0x3f | 0x80;
  }
  else if (u < 0x10000) {
    *code = '\x03';
    code[1] = (byte)(u >> 0xc) | 0xe0;
    code[2] = (byte)(u >> 6) & 0x3f | 0x80;
    code[3] = bVar1 & 0x3f | 0x80;
  }
  else {
    if (0x10ffff < u) {
      *code = '\0';
      return -1;
    }
    *code = '\x04';
    code[1] = (byte)(u >> 0x12) | 0xf0;
    code[2] = (byte)(u >> 0xc) & 0x3f | 0x80;
    code[3] = (byte)(u >> 6) & 0x3f | 0x80;
    code[4] = bVar1 & 0x3f | 0x80;
  }
  return 0;
}

Assistant:

static int decode_unicode_char(uint32_t u, char *code)
{
    if (u <= 0x7f) {
        code[0] = 1;
        code[1] = (char)u;
    } else if (u <= 0x7ff) {
        code[0] = 2;
        code[1] = (char)(0xc0 | (u >> 6));
        code[2] = (char)(0x80 | (u & 0x3f));
    } else if (u <= 0xffff) {
        code[0] = 3;
        code[1] = (char)(0xe0 | (u >> 12));
        code[2] = (char)(0x80 | ((u >> 6) & 0x3f));
        code[3] = (char)(0x80 | (u & 0x3f));
    } else if (u <= 0x10ffff) {
        code[0] = 4;
        code[1] = (char)(0xf0 | (u >> 18));
        code[2] = (char)(0x80 | ((u >> 12) & 0x3f));
        code[3] = (char)(0x80 | ((u >> 6) & 0x3f));
        code[4] = (char)(0x80 | (u & 0x3f));
    } else {
        code[0] = 0;
        return -1;
    }
    return 0;
}